

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O1

string * __thiscall
wabt::Decompiler::to_string_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this,double d)

{
  ulong uVar1;
  pointer pcVar2;
  
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>(__return_storage_ptr__,vsnprintf,0x148,"%f");
  uVar1 = __return_storage_ptr__->_M_string_length;
  while (((2 < uVar1 &&
          (pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar2[uVar1 - 1] == '0')) &&
         (pcVar2[uVar1 - 2] != '.'))) {
    std::__cxx11::string::_M_erase((ulong)__return_storage_ptr__,uVar1 - 1);
    uVar1 = __return_storage_ptr__->_M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(double d) {
    auto s = std::to_string(d);
    // Remove redundant trailing '0's that to_string produces.
    while (s.size() > 2 && s.back() == '0' && s[s.size() - 2] != '.')
      s.pop_back();
    return s;
  }